

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::TraceConfig_GuardrailOverrides::TraceConfig_GuardrailOverrides
          (TraceConfig_GuardrailOverrides *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_GuardrailOverrides_003a1bd0;
  this->max_upload_per_day_bytes_ = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

TraceConfig_GuardrailOverrides::TraceConfig_GuardrailOverrides() = default;